

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::strings_internal::AppendPieces
          (strings_internal *this,Nonnull<std::string_*> dest,
          initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces)

{
  ulong uVar1;
  size_t __n;
  long lVar2;
  void *__dest;
  long lVar3;
  size_t n;
  size_t this_size;
  long lVar4;
  
  uVar1 = *(ulong *)(this + 8);
  lVar4 = (long)pieces._M_array << 4;
  n = 0;
  for (lVar2 = 0; lVar4 != lVar2; lVar2 = lVar2 + 0x10) {
    lVar3 = *(long *)((long)&(dest->_M_dataplus)._M_p + lVar2);
    if ((lVar3 != 0) &&
       ((ulong)(*(long *)((long)&dest->_M_string_length + lVar2) - *(long *)this) <= uVar1)) {
      __assert_fail("((piece).size() == 0) || (uintptr_t((piece).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/str_cat.cc"
                    ,0xa7,
                    "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
                   );
    }
    n = n + lVar3;
  }
  AppendUninitializedTraits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::Append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,n);
  lVar2 = *(long *)this;
  __dest = (void *)(uVar1 + lVar2);
  for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 0x10) {
    __n = *(size_t *)((long)&(dest->_M_dataplus)._M_p + lVar3);
    if (__n != 0) {
      memcpy(__dest,*(void **)((long)&dest->_M_string_length + lVar3),__n);
      __dest = (void *)((long)__dest + __n);
    }
  }
  if (__dest == (void *)(lVar2 + *(long *)(this + 8))) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/str_cat.cc"
                ,0xb5,
                "void absl::strings_internal::AppendPieces(absl::Nonnull<std::string *>, std::initializer_list<absl::string_view>)"
               );
}

Assistant:

void AppendPieces(absl::Nonnull<std::string*> dest,
                  std::initializer_list<absl::string_view> pieces) {
  size_t old_size = dest->size();
  size_t to_append = 0;
  for (absl::string_view piece : pieces) {
    ASSERT_NO_OVERLAP(*dest, piece);
    to_append += piece.size();
  }
  STLStringAppendUninitializedAmortized(dest, to_append);

  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  for (absl::string_view piece : pieces) {
    const size_t this_size = piece.size();
    if (this_size != 0) {
      memcpy(out, piece.data(), this_size);
      out += this_size;
    }
  }
  assert(out == begin + dest->size());
}